

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_container_unit.c
# Opt level: O3

void mini_fuzz_recycle_array_container_intersection_inplace(void)

{
  ushort uVar1;
  ushort uVar2;
  _Bool _Var3;
  uint16_t *buffer;
  uint16_t *buffer_00;
  uint16_t *buffer_01;
  array_container_t *container;
  array_container_t *container_00;
  array_container_t *container_01;
  bitset_container_t *bitset;
  bitset_container_t *bitset_00;
  bitset_container_t *bitset_01;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  uint16_t *puVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  int32_t iVar15;
  
  splitmix64_x = 0x3039;
  buffer = (uint16_t *)malloc(0x2000);
  buffer_00 = (uint16_t *)malloc(0x2000);
  buffer_01 = (uint16_t *)malloc(0x2000);
  container = array_container_create();
  container_00 = array_container_create();
  container_01 = array_container_create();
  bitset = bitset_container_create();
  bitset_00 = bitset_container_create();
  bitset_01 = bitset_container_create();
  lVar8 = 0;
  do {
    bitset_container_clear(bitset);
    bitset_container_clear(bitset_00);
    bitset_container_clear(bitset_01);
    container->cardinality = 0;
    container_00->cardinality = 0;
    container_01->cardinality = 0;
    sVar4 = populate(buffer,0x1000);
    sVar5 = populate(buffer_00,0x1000);
    sVar6 = populate(buffer_01,0x1000);
    if (sVar4 != 0) {
      uVar11 = 0;
      iVar15 = container->cardinality;
      do {
        uVar1 = buffer[uVar11];
        if ((iVar15 == 0) ||
           ((puVar7 = container->array, iVar15 != 0x7fffffff && (puVar7[(long)iVar15 + -1] < uVar1))
           )) {
          if (iVar15 == container->capacity) {
            array_container_grow(container,iVar15 + 1,true);
            iVar15 = container->cardinality;
          }
          container->cardinality = iVar15 + 1;
          container->array[iVar15] = uVar1;
          iVar10 = iVar15 + 1;
        }
        else {
          if (iVar15 < 1) {
            uVar12 = 0;
          }
          else {
            iVar10 = iVar15 + -1;
            uVar12 = 0;
            do {
              uVar13 = iVar10 + (int)uVar12;
              uVar9 = uVar13 >> 1;
              uVar2 = *(ushort *)((long)puVar7 + (ulong)(uVar13 & 0xfffffffe));
              if (uVar2 < uVar1) {
                uVar12 = (ulong)(uVar9 + 1);
              }
              else {
                iVar10 = iVar15;
                if (uVar2 <= uVar1) goto LAB_00103736;
                iVar10 = uVar9 - 1;
              }
            } while ((int)uVar12 <= iVar10);
            iVar10 = 0x7fffffff;
            if (iVar15 == 0x7fffffff) goto LAB_00103736;
          }
          if (iVar15 == container->capacity) {
            array_container_grow(container,iVar15 + 1,true);
            puVar7 = container->array;
          }
          memmove(puVar7 + uVar12 + 1,puVar7 + uVar12,(long)(iVar15 - (int)uVar12) * 2);
          container->array[uVar12] = uVar1;
          iVar10 = container->cardinality + 1;
          container->cardinality = iVar10;
        }
LAB_00103736:
        uVar12 = bitset->words[uVar1 >> 6];
        uVar14 = uVar12 | 1L << ((ulong)uVar1 & 0x3f);
        bitset->cardinality = bitset->cardinality + (int)((uVar12 ^ uVar14) >> ((byte)uVar1 & 0x3f))
        ;
        bitset->words[uVar1 >> 6] = uVar14;
        uVar11 = (ulong)((int)uVar11 + 1);
        iVar15 = iVar10;
      } while (uVar11 < sVar4);
    }
    if (sVar5 != 0) {
      uVar11 = 0;
      iVar15 = container_00->cardinality;
      do {
        uVar1 = buffer_00[uVar11];
        if ((iVar15 == 0) ||
           ((puVar7 = container_00->array, iVar15 != 0x7fffffff &&
            (puVar7[(long)iVar15 + -1] < uVar1)))) {
          if (iVar15 == container_00->capacity) {
            array_container_grow(container_00,iVar15 + 1,true);
            iVar15 = container_00->cardinality;
          }
          container_00->cardinality = iVar15 + 1;
          container_00->array[iVar15] = uVar1;
          iVar10 = iVar15 + 1;
        }
        else {
          if (iVar15 < 1) {
            uVar12 = 0;
          }
          else {
            iVar10 = iVar15 + -1;
            uVar12 = 0;
            do {
              uVar13 = iVar10 + (int)uVar12;
              uVar9 = uVar13 >> 1;
              uVar2 = *(ushort *)((long)puVar7 + (ulong)(uVar13 & 0xfffffffe));
              if (uVar2 < uVar1) {
                uVar12 = (ulong)(uVar9 + 1);
              }
              else {
                iVar10 = iVar15;
                if (uVar2 <= uVar1) goto LAB_0010389a;
                iVar10 = uVar9 - 1;
              }
            } while ((int)uVar12 <= iVar10);
            iVar10 = 0x7fffffff;
            if (iVar15 == 0x7fffffff) goto LAB_0010389a;
          }
          if (iVar15 == container_00->capacity) {
            array_container_grow(container_00,iVar15 + 1,true);
            puVar7 = container_00->array;
          }
          memmove(puVar7 + uVar12 + 1,puVar7 + uVar12,(long)(iVar15 - (int)uVar12) * 2);
          container_00->array[uVar12] = uVar1;
          iVar10 = container_00->cardinality + 1;
          container_00->cardinality = iVar10;
        }
LAB_0010389a:
        uVar12 = bitset_00->words[uVar1 >> 6];
        uVar14 = uVar12 | 1L << ((ulong)uVar1 & 0x3f);
        bitset_00->cardinality =
             bitset_00->cardinality + (int)((uVar12 ^ uVar14) >> ((byte)uVar1 & 0x3f));
        bitset_00->words[uVar1 >> 6] = uVar14;
        uVar11 = (ulong)((int)uVar11 + 1);
        iVar15 = iVar10;
      } while (uVar11 < sVar5);
    }
    if (sVar6 != 0) {
      iVar15 = container_01->cardinality;
      uVar11 = 0;
      do {
        uVar1 = buffer_01[uVar11];
        if ((iVar15 == 0) ||
           ((puVar7 = container_01->array, iVar15 != 0x7fffffff &&
            (puVar7[(long)iVar15 + -1] < uVar1)))) {
          if (iVar15 == container_01->capacity) {
            array_container_grow(container_01,iVar15 + 1,true);
            iVar15 = container_01->cardinality;
          }
          container_01->cardinality = iVar15 + 1;
          container_01->array[iVar15] = uVar1;
          iVar10 = iVar15 + 1;
        }
        else {
          if (iVar15 < 1) {
            uVar12 = 0;
          }
          else {
            iVar10 = iVar15 + -1;
            uVar12 = 0;
            do {
              uVar13 = iVar10 + (int)uVar12;
              uVar9 = uVar13 >> 1;
              uVar2 = *(ushort *)((long)puVar7 + (ulong)(uVar13 & 0xfffffffe));
              if (uVar2 < uVar1) {
                uVar12 = (ulong)(uVar9 + 1);
              }
              else {
                iVar10 = iVar15;
                if (uVar2 <= uVar1) goto LAB_001039ea;
                iVar10 = uVar9 - 1;
              }
            } while ((int)uVar12 <= iVar10);
            iVar10 = 0x7fffffff;
            if (iVar15 == 0x7fffffff) goto LAB_001039ea;
          }
          if (iVar15 == container_01->capacity) {
            array_container_grow(container_01,iVar15 + 1,true);
            puVar7 = container_01->array;
          }
          memmove(puVar7 + uVar12 + 1,puVar7 + uVar12,(long)(iVar15 - (int)uVar12) * 2);
          container_01->array[uVar12] = uVar1;
          iVar10 = container_01->cardinality + 1;
          container_01->cardinality = iVar10;
        }
LAB_001039ea:
        iVar15 = iVar10;
        uVar12 = bitset_01->words[uVar1 >> 6];
        uVar14 = uVar12 | 1L << ((ulong)uVar1 & 0x3f);
        bitset_01->cardinality =
             bitset_01->cardinality + (int)((uVar12 ^ uVar14) >> ((byte)uVar1 & 0x3f));
        bitset_01->words[uVar1 >> 6] = uVar14;
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (uVar11 < sVar6);
    }
    bitset->cardinality = -1;
    array_container_intersection_inplace(container,container_00);
    bitset_container_and_nocard(bitset,bitset_00,bitset);
    _Var3 = array_container_equal_bitset(container,bitset);
    _assert_true((ulong)_Var3,"array_container_equal_bitset(array1, bitset1)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                 ,0x14e);
    array_container_intersection_inplace(container,container_01);
    bitset_container_and_nocard(bitset,bitset_01,bitset);
    _Var3 = array_container_equal_bitset(container,bitset);
    _assert_true((ulong)_Var3,"array_container_equal_bitset(array1, bitset1)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                 ,0x152);
    if (sVar4 != 0) {
      iVar15 = container->cardinality;
      uVar11 = 0;
      do {
        uVar1 = buffer[uVar11];
        if ((iVar15 == 0) ||
           ((puVar7 = container->array, iVar15 != 0x7fffffff && (puVar7[(long)iVar15 + -1] < uVar1))
           )) {
          if (iVar15 == container->capacity) {
            array_container_grow(container,iVar15 + 1,true);
            iVar15 = container->cardinality;
          }
          container->cardinality = iVar15 + 1;
          container->array[iVar15] = uVar1;
          iVar10 = iVar15 + 1;
        }
        else {
          if (iVar15 < 1) {
            uVar12 = 0;
          }
          else {
            iVar10 = iVar15 + -1;
            uVar12 = 0;
            do {
              uVar13 = iVar10 + (int)uVar12;
              uVar9 = uVar13 >> 1;
              uVar2 = *(ushort *)((long)puVar7 + (ulong)(uVar13 & 0xfffffffe));
              if (uVar2 < uVar1) {
                uVar12 = (ulong)(uVar9 + 1);
              }
              else {
                iVar10 = iVar15;
                if (uVar2 <= uVar1) goto LAB_00103bb6;
                iVar10 = uVar9 - 1;
              }
            } while ((int)uVar12 <= iVar10);
            iVar10 = 0x7fffffff;
            if (iVar15 == 0x7fffffff) goto LAB_00103bb6;
          }
          if (iVar15 == container->capacity) {
            array_container_grow(container,iVar15 + 1,true);
            puVar7 = container->array;
          }
          memmove(puVar7 + uVar12 + 1,puVar7 + uVar12,(long)(iVar15 - (int)uVar12) * 2);
          container->array[uVar12] = uVar1;
          iVar10 = container->cardinality + 1;
          container->cardinality = iVar10;
        }
LAB_00103bb6:
        iVar15 = iVar10;
        uVar12 = bitset->words[uVar1 >> 6];
        uVar14 = uVar12 | 1L << ((ulong)uVar1 & 0x3f);
        bitset->cardinality = bitset->cardinality + (int)((uVar12 ^ uVar14) >> ((byte)uVar1 & 0x3f))
        ;
        bitset->words[uVar1 >> 6] = uVar14;
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (uVar11 < sVar4);
    }
    bitset->cardinality = -1;
    _Var3 = array_container_equal_bitset(container,bitset);
    _assert_true((ulong)_Var3,"array_container_equal_bitset(array1, bitset1)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                 ,0x159);
    array_container_intersection_inplace(container,container_00);
    bitset_container_and_nocard(bitset,bitset_00,bitset);
    _Var3 = array_container_equal_bitset(container,bitset);
    _assert_true((ulong)_Var3,"array_container_equal_bitset(array1, bitset1)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                 ,0x15d);
    array_container_intersection_inplace(container,container_01);
    bitset_container_and_nocard(bitset,bitset_01,bitset);
    _Var3 = array_container_equal_bitset(container,bitset);
    _assert_true((ulong)_Var3,"array_container_equal_bitset(array1, bitset1)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                 ,0x161);
    lVar8 = lVar8 + 1;
    if (lVar8 == 3000) {
      array_container_free(container);
      array_container_free(container_00);
      array_container_free(container_01);
      bitset_container_free(bitset);
      bitset_container_free(bitset_00);
      bitset_container_free(bitset_01);
      free(buffer);
      free(buffer_00);
      free(buffer_01);
      return;
    }
  } while( true );
}

Assistant:

static inline void splitmix64_seed(uint64_t seed) { splitmix64_x = seed; }